

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_test.cc
# Opt level: O0

void re2::RegexpSearchTests(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_1b8;
  StringPiece local_38;
  StringPiece local_28;
  undefined8 *local_18;
  RegexpTest *t;
  int i;
  int failures;
  
  t._4_4_ = 0;
  for (t._0_4_ = 0; (int)t < 0xea; t._0_4_ = (int)t + 1) {
    local_18 = (undefined8 *)(simple_tests + (long)(int)t * 0x10);
    StringPiece::StringPiece(&local_28,(char *)*local_18);
    StringPiece::StringPiece(&local_38,(char *)local_18[1]);
    bVar1 = TestRegexpOnText(&local_28,&local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      t._4_4_ = t._4_4_ + 1;
    }
  }
  if (t._4_4_ != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/search_test.cc"
               ,0x147);
    poVar2 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar2,"Check failed: (failures) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
  }
  return;
}

Assistant:

TEST(Regexp, SearchTests) {
  int failures = 0;
  for (int i = 0; i < arraysize(simple_tests); i++) {
    const RegexpTest& t = simple_tests[i];
    if (!TestRegexpOnText(t.regexp, t.text))
      failures++;

#ifdef LOGGING
    // Build a dummy ExhaustiveTest call that will trigger just
    // this one test, so that we log the test case.
    vector<string> atom, alpha, ops;
    atom.push_back(StringPiece(t.regexp).as_string());
    alpha.push_back(StringPiece(t.text).as_string());
    ExhaustiveTest(1, 0, atom, ops, 1, alpha, "", "");
#endif

  }
  EXPECT_EQ(failures, 0);
}